

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

void main_cold_3(void)

{
  ap_log(AP_LOG_LEVEL_ERROR,"Empty SSH_CLIENT environment variable\n");
  return;
}

Assistant:

static int init_client_ip (AP_CTX *ctx)
{
	int			rc				= AP_NO_ERROR;
	const char	*var			= NULL; 
	char		*p				= NULL;
	char		*state			= NULL;

	var = getenv ("SSH_CLIENT"); 
	if (var == NULL)
	{
		ap_error ("Can not get SSH_CLIENT environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	if (*var == '\0')
	{
		ap_error ("Empty SSH_CLIENT environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	ctx->client_ip = strdup (var);
	if (ctx->client_ip == NULL)
	{
		ap_error ("Can not allocate memory for 'ctx->client_ip'\n");
		rc = AP_ERROR_NO_MEMORY;

		goto finish;
	}

	p = strtok_r (ctx->client_ip, " \t", &state);
	if (p == NULL)
	{
		ap_error ("Invalid SSH_CLIENT variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}
	
finish:
	if (rc != AP_NO_ERROR)
	{
		if (ctx->client_ip != NULL)
		{
			free (ctx->client_ip);
		}
	}

	return rc;
}